

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O1

void __thiscall QByteArrayMatcher::setPattern(QByteArrayMatcher *this,QByteArray *pattern)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  
  QByteArray::operator=(&this->q_pattern,pattern);
  pcVar3 = (pattern->d).ptr;
  if ((uchar *)pcVar3 == (uchar *)0x0) {
    pcVar3 = "";
  }
  (this->field_2).p.p = (uchar *)pcVar3;
  lVar1 = (pattern->d).size;
  (this->field_2).p.l = lVar1;
  lVar5 = 0xff;
  if (lVar1 < 0xff) {
    lVar5 = lVar1;
  }
  memset(&this->field_2,(int)lVar5,0x100);
  if (lVar1 != 0) {
    cVar4 = (char)lVar5;
    lVar2 = 0;
    do {
      cVar4 = cVar4 + -1;
      *(char *)((long)&this->field_2 + (ulong)((uchar *)pcVar3)[lVar2 + (lVar1 - lVar5)]) = cVar4;
      lVar2 = lVar2 + 1;
    } while ((int)lVar2 != (int)lVar5);
  }
  return;
}

Assistant:

void QByteArrayMatcher::setPattern(const QByteArray &pattern)
{
    q_pattern = pattern;
    p.p = reinterpret_cast<const uchar *>(pattern.constData());
    p.l = pattern.size();
    bm_init_skiptable(p.p, p.l, p.q_skiptable);
}